

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O0

void __thiscall QBenchmarkGlobalData::QBenchmarkGlobalData(QBenchmarkGlobalData *this)

{
  QBenchmarkGlobalData *in_RDI;
  Mode mode;
  
  in_RDI->measurer = (QBenchmarkMeasurerBase *)0x0;
  QBenchmarkContext::QBenchmarkContext(&in_RDI->context);
  in_RDI->walltimeMinimum = -1;
  in_RDI->iterationCount = -1;
  in_RDI->medianIterationCount = -1;
  in_RDI->createChart = false;
  in_RDI->verboseOutput = false;
  mode = (Mode)((ulong)&in_RDI->callgrindOutFileBase >> 0x20);
  QString::QString((QString *)0x11ed6c);
  in_RDI->minimumTotal = -1;
  in_RDI->mode_ = WallTime;
  setMode(in_RDI,mode);
  return;
}

Assistant:

QBenchmarkGlobalData::QBenchmarkGlobalData()
{
    setMode(mode_);
}